

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O3

void luv2lch(Triplet *in_out)

{
  double dVar1;
  double __x;
  double __y;
  double dVar2;
  double dVar3;
  
  dVar1 = in_out->a;
  __x = in_out->b;
  __y = in_out->c;
  dVar3 = SQRT(__x * __x + __y * __y);
  dVar2 = 0.0;
  if (1e-08 <= dVar3) {
    dVar2 = atan2(__y,__x);
    dVar2 = dVar2 * 57.29577951308232;
    if (dVar2 < 0.0) {
      dVar2 = dVar2 + 360.0;
    }
  }
  in_out->a = dVar1;
  in_out->b = dVar3;
  in_out->c = dVar2;
  return;
}

Assistant:

static void
luv2lch(Triplet* in_out)
{
    double l = in_out->a;
    double u = in_out->b;
    double v = in_out->c;
    double h;
    double c = sqrt(u * u + v * v);

    /* Grays: disambiguate hue */
    if(c < 0.00000001) {
        h = 0;
    } else {
        h = atan2(v, u) * 57.29577951308232087680;  /* (180 / pi) */
        if(h < 0.0)
            h += 360.0;
    }

    in_out->a = l;
    in_out->b = c;
    in_out->c = h;
}